

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O1

void __thiscall
ClownLZSS::Internal::BitField::
WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)1,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)1,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
::Push(WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)1,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)1,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
       *this,bool bit)

{
  uint *puVar1;
  undefined7 in_register_00000031;
  anon_class_8_1_8991fb9c local_10;
  
  this->bits = (ulong)(uint)((int)CONCAT71(in_register_00000031,bit) << 0xf) | this->bits >> 1;
  puVar1 = &this->bits_remaining;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  local_10.this =
       (DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)1,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
        *)this;
  DescriptorFieldWriter<2u,(ClownLZSS::Internal::BitField::WriteWhen)1,(ClownLZSS::Internal::BitField::PushWhere)1,(ClownLZSS::Internal::Endian)1,ClownLZSS::CompressorOutput<std::ofstream>&>
  ::
  Finish<ClownLZSS::Internal::BitField::DescriptorFieldWriter<2u,(ClownLZSS::Internal::BitField::WriteWhen)1,(ClownLZSS::Internal::BitField::PushWhere)1,(ClownLZSS::Internal::Endian)1,ClownLZSS::CompressorOutput<std::ofstream>&>::WriteBitsImplementation()::_lambda()_1_>
            ((DescriptorFieldWriter<2u,(ClownLZSS::Internal::BitField::WriteWhen)1,(ClownLZSS::Internal::BitField::PushWhere)1,(ClownLZSS::Internal::Endian)1,ClownLZSS::CompressorOutput<std::ofstream>&>
              *)this,&local_10);
  DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)1,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  ::Begin((DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)1,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
           *)this);
  return;
}

Assistant:

void Push(const bool bit)
				{
					const auto &CheckWriteBits = [&]()
					{
						if (bits_remaining == 0)
						{
							WriteBits();
						}
					};

					if constexpr(write_when == WriteWhen::BeforePush)
						CheckWriteBits();

					if constexpr(push_where == PushWhere::High)
					{
						bits >>= 1;
						bits |= bit << (total_bits - 1);
					}
					else //if constexpr(push_where == PushWhere::Low)
					{
						bits <<= 1;
						bits |= bit;
					}

					--bits_remaining;

					if constexpr(write_when == WriteWhen::AfterPush)
						CheckWriteBits();
				}